

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_runtime_api.cc
# Opt level: O0

int TVMFuncCreateFromCFunc
              (TVMPackedCFunc func,void *resource_handle,TVMPackedCFuncFinalizer fin,
              TVMFunctionHandle *out)

{
  PackedFunc *pPVar1;
  runtime_error *_except_;
  anon_class_24_2_f7b4cb12 local_c0;
  FType local_a8;
  undefined1 local_88 [8];
  shared_ptr<void> rpack;
  anon_class_16_2_f6ef95c0 local_70;
  FType local_60;
  TVMFunctionHandle *local_30;
  TVMFunctionHandle *out_local;
  TVMPackedCFuncFinalizer fin_local;
  void *resource_handle_local;
  TVMPackedCFunc func_local;
  
  local_30 = out;
  out_local = (TVMFunctionHandle *)fin;
  fin_local = (TVMPackedCFuncFinalizer)resource_handle;
  resource_handle_local = func;
  if (fin == (TVMPackedCFuncFinalizer)0x0) {
    pPVar1 = (PackedFunc *)operator_new(0x20);
    rpack.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 1;
    local_70.func = (TVMPackedCFunc)resource_handle_local;
    local_70.resource_handle = fin_local;
    std::function<void(tvm::runtime::TVMArgs,tvm::runtime::TVMRetValue*)>::
    function<TVMFuncCreateFromCFunc::__0,void>
              ((function<void(tvm::runtime::TVMArgs,tvm::runtime::TVMRetValue*)> *)&local_60,
               &local_70);
    tvm::runtime::PackedFunc::PackedFunc(pPVar1,&local_60);
    rpack.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._7_1_ = 0;
    *local_30 = pPVar1;
    std::function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)>::~function(&local_60);
  }
  else {
    std::shared_ptr<void>::shared_ptr<void,void(*)(void*),void>
              ((shared_ptr<void> *)local_88,resource_handle,fin);
    pPVar1 = (PackedFunc *)operator_new(0x20);
    local_c0.func = (TVMPackedCFunc)resource_handle_local;
    std::shared_ptr<void>::shared_ptr(&local_c0.rpack,(shared_ptr<void> *)local_88);
    std::function<void(tvm::runtime::TVMArgs,tvm::runtime::TVMRetValue*)>::
    function<TVMFuncCreateFromCFunc::__1,void>
              ((function<void(tvm::runtime::TVMArgs,tvm::runtime::TVMRetValue*)> *)&local_a8,
               &local_c0);
    tvm::runtime::PackedFunc::PackedFunc(pPVar1,&local_a8);
    *local_30 = pPVar1;
    std::function<void_(tvm::runtime::TVMArgs,_tvm::runtime::TVMRetValue_*)>::~function(&local_a8);
    TVMFuncCreateFromCFunc::$_1::~__1((__1 *)&local_c0);
    std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)local_88);
  }
  return 0;
}

Assistant:

int TVMFuncCreateFromCFunc(TVMPackedCFunc func,
                           void* resource_handle,
                           TVMPackedCFuncFinalizer fin,
                           TVMFunctionHandle *out) {
  API_BEGIN();
  if (fin == nullptr) {
    *out = new PackedFunc(
        [func, resource_handle](TVMArgs args, TVMRetValue* rv) {
          int ret = func((TVMValue*)args.values, (int*)args.type_codes, // NOLINT(*)
                         args.num_args, rv, resource_handle);
          if (ret != 0) {
            throw dmlc::Error(TVMGetLastError() + ::dmlc::StackTrace());
          }
        });
  } else {
    // wrap it in a shared_ptr, with fin as deleter.
    // so fin will be called when the lambda went out of scope.
    std::shared_ptr<void> rpack(resource_handle, fin);
    *out = new PackedFunc(
        [func, rpack](TVMArgs args, TVMRetValue* rv) {
          int ret = func((TVMValue*)args.values, (int*)args.type_codes, // NOLINT(*)
                         args.num_args, rv, rpack.get());
          if (ret != 0) {
            throw dmlc::Error(TVMGetLastError() + ::dmlc::StackTrace());
          }
      });
  }
  API_END();
}